

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void Curl_bufq_free(bufq *q)

{
  bufq *q_local;
  
  chunk_list_free(&q->head);
  chunk_list_free(&q->spare);
  q->tail = (buf_chunk *)0x0;
  q->chunk_count = 0;
  return;
}

Assistant:

void Curl_bufq_free(struct bufq *q)
{
  chunk_list_free(&q->head);
  chunk_list_free(&q->spare);
  q->tail = NULL;
  q->chunk_count = 0;
}